

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer-test.c++
# Opt level: O3

void __thiscall capnp::compiler::anon_unknown_0::TestCase361::run(TestCase361 *this)

{
  char *pcVar1;
  int iVar2;
  size_t in_RCX;
  size_t sVar3;
  char *__s2;
  char *ptrCopy;
  StringPtr constText;
  StringPtr constText_00;
  String local_48;
  char *local_28;
  
  constText.content.size_ = in_RCX;
  constText.content.ptr = (char *)0x11;
  doLex<capnp::compiler::LexedTokens>(&local_48,(anon_unknown_0 *)anon_var_dwarf_3232c2,constText);
  sVar3 = local_48.content.size_;
  pcVar1 = local_48.content.ptr;
  __s2 = local_48.content.ptr;
  if (local_48.content.size_ == 0) {
    __s2 = "";
  }
  iVar2 = strcmp("(tokens = [(identifier = \'foo\', startByte = 3, endByte = 6), (identifier = \'bar\', startByte = 7, endByte = 10), (identifier = \'baz\', startByte = 13, endByte = 16)])"
                 ,__s2);
  if (pcVar1 != (char *)0x0) {
    local_48.content.ptr = (char *)0x0;
    local_48.content.size_ = 0;
    (**(local_48.content.disposer)->_vptr_ArrayDisposer)
              (local_48.content.disposer,pcVar1,1,sVar3,sVar3,0);
    in_RCX = sVar3;
  }
  if ((iVar2 != 0) && (kj::_::Debug::minSeverity < 3)) {
    constText_00.content.size_ = in_RCX;
    constText_00.content.ptr = (char *)0x11;
    doLex<capnp::compiler::LexedTokens>
              (&local_48,(anon_unknown_0 *)anon_var_dwarf_3232c2,constText_00);
    local_28 = "";
    if (local_48.content.size_ != 0) {
      local_28 = local_48.content.ptr;
    }
    kj::_::Debug::log<char_const(&)[280],char_const(&)[165],char_const*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/lexer-test.c++"
               ,0x170,ERROR,
               "\"failed: expected \" \"::strcmp(\\\"(tokens = [\\\" \\\"(identifier = \'foo\', startByte = 3, endByte = 6), \\\" \\\"(identifier = \'bar\', startByte = 7, endByte = 10), \\\" \\\"(identifier = \'baz\', startByte = 13, endByte = 16)\\\" \\\"])\\\", doLex<LexedTokens>(\\\"\\\\xef\\\\xbb\\\\xbf\\\"\\\"foo bar\\\\xef\\\\xbb\\\\xbf\\\"\\\"baz\\\").cStr()) == 0\", \"(tokens = [\" \"(identifier = \'foo\', startByte = 3, endByte = 6), \" \"(identifier = \'bar\', startByte = 7, endByte = 10), \" \"(identifier = \'baz\', startByte = 13, endByte = 16)\" \"])\", doLex<LexedTokens>(\"\\xef\\xbb\\xbf\"\"foo bar\\xef\\xbb\\xbf\"\"baz\").cStr()"
               ,(char (*) [280])
                "failed: expected ::strcmp(\"(tokens = [\" \"(identifier = \'foo\', startByte = 3, endByte = 6), \" \"(identifier = \'bar\', startByte = 7, endByte = 10), \" \"(identifier = \'baz\', startByte = 13, endByte = 16)\" \"])\", doLex<LexedTokens>(\"\\xef\\xbb\\xbf\"\"foo bar\\xef\\xbb\\xbf\"\"baz\").cStr()) == 0"
               ,(char (*) [165])
                "(tokens = [(identifier = \'foo\', startByte = 3, endByte = 6), (identifier = \'bar\', startByte = 7, endByte = 10), (identifier = \'baz\', startByte = 13, endByte = 16)])"
               ,&local_28);
    sVar3 = local_48.content.size_;
    pcVar1 = local_48.content.ptr;
    if (local_48.content.ptr != (char *)0x0) {
      local_48.content.ptr = (char *)0x0;
      local_48.content.size_ = 0;
      (**(local_48.content.disposer)->_vptr_ArrayDisposer)
                (local_48.content.disposer,pcVar1,1,sVar3,sVar3,0);
    }
  }
  return;
}

Assistant:

TEST(Lexer, Utf8Bom) {
  EXPECT_STREQ(
      "(tokens = ["
        "(identifier = 'foo', startByte = 3, endByte = 6), "
        "(identifier = 'bar', startByte = 7, endByte = 10), "
        "(identifier = 'baz', startByte = 13, endByte = 16)"
      "])",
      doLex<LexedTokens>("\xef\xbb\xbf""foo bar\xef\xbb\xbf""baz").cStr());
}